

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeEnsemble.pb.cc
# Opt level: O3

void __thiscall
CoreML::Specification::TreeEnsembleParameters::TreeEnsembleParameters
          (TreeEnsembleParameters *this,TreeEnsembleParameters *from)

{
  ulong uVar1;
  
  (this->super_MessageLite)._internal_metadata_.ptr_ = 0;
  (this->super_MessageLite)._vptr_MessageLite = (_func_int **)&PTR__TreeEnsembleParameters_0048f320;
  (this->nodes_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->nodes_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->nodes_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->nodes_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  google::protobuf::internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<CoreML::Specification::TreeEnsembleParameters_TreeNode>::TypeHandler>
            (&(this->nodes_).super_RepeatedPtrFieldBase,&(from->nodes_).super_RepeatedPtrFieldBase);
  google::protobuf::RepeatedField<double>::RepeatedField
            (&this->basepredictionvalue_,&from->basepredictionvalue_);
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  uVar1 = (from->super_MessageLite)._internal_metadata_.ptr_;
  if ((uVar1 & 1) != 0) {
    google::protobuf::internal::InternalMetadata::DoMergeFrom<std::__cxx11::string>
              (&(this->super_MessageLite)._internal_metadata_,
               (string *)((uVar1 & 0xfffffffffffffffc) + 8));
  }
  this->numpredictiondimensions_ = from->numpredictiondimensions_;
  return;
}

Assistant:

TreeEnsembleParameters::TreeEnsembleParameters(const TreeEnsembleParameters& from)
  : ::PROTOBUF_NAMESPACE_ID::MessageLite(),
      nodes_(from.nodes_),
      basepredictionvalue_(from.basepredictionvalue_) {
  _internal_metadata_.MergeFrom<std::string>(from._internal_metadata_);
  numpredictiondimensions_ = from.numpredictiondimensions_;
  // @@protoc_insertion_point(copy_constructor:CoreML.Specification.TreeEnsembleParameters)
}